

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

__sighandler_t __thiscall
r_exec::SRMonitor::signal(SRMonitor *this,int __sig,__sighandler_t __handler)

{
  PrimaryMDLController *pPVar1;
  MDLController *pMVar2;
  bool bVar3;
  int iVar4;
  Fact *pFVar5;
  ulong uVar6;
  HLPBindingMap *pHVar7;
  _Fact *p_Var8;
  Goal *pGVar9;
  Sim *pSVar10;
  Controller *root;
  undefined7 extraout_var;
  undefined4 extraout_var_01;
  undefined7 extraout_var_00;
  undefined4 extraout_var_02;
  bool simulation_local;
  SRMonitor *this_local;
  
  pFVar5 = core::P<r_exec::Fact>::operator->
                     (&(this->super_SGMonitor).super__GMonitor.super_Monitor.target);
  uVar6 = (**(code **)((long)(pFVar5->super__Fact).super_LObject.
                             super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code
                             .super__Object._vptr__Object + 0x70))();
  if ((uVar6 & 1) == 0) {
    if ((__sig & 1U) == 0) {
      pPVar1 = (PrimaryMDLController *)
               (this->super_SGMonitor).super__GMonitor.super_Monitor.controller;
      pFVar5 = core::P::operator_cast_to_Fact_
                         ((P *)&(this->super_SGMonitor).super__GMonitor.super_Monitor.target);
      pHVar7 = core::P::operator_cast_to_HLPBindingMap_
                         ((P *)&(this->super_SGMonitor).super__GMonitor.super_Monitor.bindings);
      bVar3 = PrimaryMDLController::check_simulated_imdl(pPVar1,pFVar5,pHVar7,(Controller *)0x0);
      uVar6 = CONCAT71(extraout_var_00,bVar3);
      if (bVar3) {
        pMVar2 = (this->super_SGMonitor).super__GMonitor.super_Monitor.controller;
        pFVar5 = core::P::operator_cast_to_Fact_
                           ((P *)&(this->super_SGMonitor).super__GMonitor.super_Monitor.target);
        iVar4 = (*(pMVar2->super_HLPController).super_OController.super_Controller.super__Object.
                  _vptr__Object[0x10])(pMVar2,pFVar5,0,0);
        uVar6 = CONCAT44(extraout_var_02,iVar4);
      }
    }
    else {
      pPVar1 = (PrimaryMDLController *)
               (this->super_SGMonitor).super__GMonitor.super_Monitor.controller;
      pFVar5 = core::P::operator_cast_to_Fact_
                         ((P *)&(this->super_SGMonitor).super__GMonitor.super_Monitor.target);
      pHVar7 = core::P::operator_cast_to_HLPBindingMap_
                         ((P *)&(this->super_SGMonitor).super__GMonitor.super_Monitor.bindings);
      p_Var8 = &core::P<r_exec::Fact>::operator->
                          (&(this->super_SGMonitor).super__GMonitor.super_Monitor.target)->
                super__Fact;
      pGVar9 = _Fact::get_goal(p_Var8);
      pSVar10 = core::P<r_exec::Sim>::operator->(&pGVar9->sim);
      root = core::P::operator_cast_to_Controller_((P *)&pSVar10->root);
      bVar3 = PrimaryMDLController::check_simulated_imdl(pPVar1,pFVar5,pHVar7,root);
      uVar6 = CONCAT71(extraout_var,bVar3);
      if (bVar3) {
        pMVar2 = (this->super_SGMonitor).super__GMonitor.super_Monitor.controller;
        pFVar5 = core::P::operator_cast_to_Fact_
                           ((P *)&(this->super_SGMonitor).super__GMonitor.super_Monitor.target);
        p_Var8 = core::P::operator_cast_to__Fact_
                           ((P *)&(this->super_SGMonitor).super__GMonitor.super_Monitor.target);
        iVar4 = (*(pMVar2->super_HLPController).super_OController.super_Controller.super__Object.
                  _vptr__Object[0x10])(pMVar2,pFVar5,1,p_Var8);
        uVar6 = CONCAT44(extraout_var_01,iVar4);
      }
    }
    this_local._7_1_ = 0;
  }
  else {
    this_local._7_1_ = 1;
  }
  return (__sighandler_t)CONCAT71((int7)(uVar6 >> 8),this_local._7_1_);
}

Assistant:

bool SRMonitor::signal(bool simulation)
{
    if (target->is_invalidated()) {
        return true;
    }

    if (simulation) {
        if (((PrimaryMDLController *)controller)->check_simulated_imdl(target, bindings, target->get_goal()->sim->root)) {
            ((PMDLController *)controller)->register_simulated_goal_outcome(target, true, target);    // report a simulated success.
        }
    } else {
        if (((PrimaryMDLController *)controller)->check_simulated_imdl(target, bindings, nullptr)) {
            ((PMDLController *)controller)->register_simulated_goal_outcome(target, false, nullptr);    // report a simulated failure.
        }
    }

    return false;
}